

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O3

void duckdb_je_emap_do_assert_not_mapped(tsdn_t *tsdn,emap_t *emap,edata_t *edata)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void *pvVar4;
  rtree_leaf_elm_t *prVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t *rtree_ctx_00;
  ulong uVar10;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t rStack_1a8;
  
  rtree_ctx_00 = &rStack_1a8;
  rtree_ctx = &rStack_1a8;
  pvVar4 = edata->e_addr;
  if (tsdn == (tsdn_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(&rStack_1a8);
  }
  else {
    rtree_ctx_00 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar7 = (ulong)pvVar4 & 0xffffffffc0000000;
  uVar10 = (ulong)(((uint)((ulong)pvVar4 >> 0x1e) & 0xf) << 4);
  puVar1 = (ulong *)((long)&rtree_ctx_00->cache[0].leafkey + uVar10);
  uVar10 = *(ulong *)((long)&rtree_ctx_00->cache[0].leafkey + uVar10);
  if (uVar10 != uVar7) {
    if (rtree_ctx_00->l2_cache[0].leafkey == uVar7) {
      prVar5 = rtree_ctx_00->l2_cache[0].leaf;
      rtree_ctx_00->l2_cache[0].leafkey = uVar10;
      rtree_ctx_00->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
      *puVar1 = uVar7;
      puVar1[1] = (ulong)prVar5;
    }
    else {
      lVar9 = 0x118;
      do {
        if (*(ulong *)((long)rtree_ctx_00->cache + lVar9 + -8) == uVar7) {
          uVar8 = *(ulong *)((long)&rtree_ctx_00->cache[0].leafkey + lVar9);
          puVar2 = (undefined8 *)((long)rtree_ctx_00->cache + lVar9 + -0x18);
          uVar6 = puVar2[1];
          puVar3 = (undefined8 *)((long)rtree_ctx_00->cache + lVar9 + -8);
          *puVar3 = *puVar2;
          puVar3[1] = uVar6;
          *(ulong *)((long)rtree_ctx_00->cache + lVar9 + -0x18) = uVar10;
          *(ulong *)((long)(rtree_ctx_00->cache + -1) + lVar9) = puVar1[1];
          *puVar1 = uVar7;
          puVar1[1] = uVar8;
          goto LAB_01173e0b;
        }
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 0x188);
      duckdb_je_rtree_leaf_elm_lookup_hard
                (tsdn,&emap->rtree,rtree_ctx_00,(ulong)pvVar4 & 0xfffffffffffff000,false,false);
    }
  }
LAB_01173e0b:
  uVar10 = (((edata->field_2).e_size_esn & 0xfffffffffffff000) +
           ((ulong)edata->e_addr & 0xfffffffffffff000)) - 0x1000;
  if (tsdn == (tsdn_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(&rStack_1a8);
  }
  else {
    rtree_ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar8 = uVar10 & 0xffffffffc0000000;
  uVar7 = (ulong)(((uint)(uVar10 >> 0x1e) & 0xf) << 4);
  puVar1 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar7);
  uVar7 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar7);
  if (uVar7 != uVar8) {
    if (rtree_ctx->l2_cache[0].leafkey == uVar8) {
      prVar5 = rtree_ctx->l2_cache[0].leaf;
      rtree_ctx->l2_cache[0].leafkey = uVar7;
      rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
      *puVar1 = uVar8;
      puVar1[1] = (ulong)prVar5;
    }
    else {
      lVar9 = 0x118;
      do {
        if (*(ulong *)((long)rtree_ctx->cache + lVar9 + -8) == uVar8) {
          uVar10 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + lVar9);
          puVar2 = (undefined8 *)((long)rtree_ctx->cache + lVar9 + -0x18);
          uVar6 = puVar2[1];
          puVar3 = (undefined8 *)((long)rtree_ctx->cache + lVar9 + -8);
          *puVar3 = *puVar2;
          puVar3[1] = uVar6;
          *(ulong *)((long)rtree_ctx->cache + lVar9 + -0x18) = uVar7;
          *(ulong *)((long)(rtree_ctx->cache + -1) + lVar9) = puVar1[1];
          *puVar1 = uVar8;
          puVar1[1] = uVar10;
          return;
        }
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 0x188);
      duckdb_je_rtree_leaf_elm_lookup_hard(tsdn,&emap->rtree,rtree_ctx,uVar10,false,false);
    }
  }
  return;
}

Assistant:

void
emap_do_assert_not_mapped(tsdn_t *tsdn, emap_t *emap, edata_t *edata) {
	emap_full_alloc_ctx_t context1 = {0};
	emap_full_alloc_ctx_try_lookup(tsdn, emap, edata_base_get(edata),
	    &context1);
	assert(context1.edata == NULL);

	emap_full_alloc_ctx_t context2 = {0};
	emap_full_alloc_ctx_try_lookup(tsdn, emap, edata_last_get(edata),
	    &context2);
	assert(context2.edata == NULL);
}